

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall
Catch::CompactReporter::AssertionPrinter::printRemainingMessages(AssertionPrinter *this,Code colour)

{
  pointer pMVar1;
  MessageInfo *pMVar2;
  ostream *poVar3;
  pointer pMVar4;
  Colour colourGuard;
  Colour colourGuard_1;
  undefined1 *local_78;
  long local_70;
  undefined1 local_68 [16];
  undefined1 local_58 [8];
  _Alloc_hider local_50;
  char local_40 [16];
  
  pMVar1 = (this->messages).
           super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pMVar4 = (this->itMessage)._M_current;
  if (pMVar4 != pMVar1) {
    Colour::use(colour);
    poVar3 = this->stream;
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," with ",6);
    local_78 = local_68;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"message","");
    local_58 = (undefined1  [8])(((long)pMVar1 - (long)pMVar4 >> 3) * -0x1111111111111111);
    local_50._M_p = local_40;
    std::__cxx11::string::_M_construct<char*>((string *)&local_50,local_78,local_78 + local_70);
    operator<<(poVar3,(pluralise *)local_58);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,":",1);
    if (local_50._M_p != local_40) {
      operator_delete(local_50._M_p);
    }
    if (local_78 != local_68) {
      operator_delete(local_78);
    }
    Colour::use(None);
    pMVar4 = (this->itMessage)._M_current;
    while (pMVar4 != pMVar1) {
      if ((this->printInfoMessages != false) || (pMVar4->type != Info)) {
        poVar3 = this->stream;
        std::__ostream_insert<char,std::char_traits<char>>(poVar3," \'",2);
        pMVar2 = (this->itMessage)._M_current;
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar3,(pMVar2->message)._M_dataplus._M_p,
                            (pMVar2->message)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\'",1);
        pMVar4 = (this->itMessage)._M_current + 1;
        (this->itMessage)._M_current = pMVar4;
        if (pMVar4 != pMVar1) {
          local_58 = (undefined1  [8])((ulong)local_58 & 0xffffffffffffff00);
          Colour::use(FileName);
          std::__ostream_insert<char,std::char_traits<char>>(this->stream," and",4);
          Colour::use(None);
          pMVar4 = (this->itMessage)._M_current;
        }
      }
    }
  }
  return;
}

Assistant:

inline void arcSafeRelease( NSObject* obj ) {
    [obj release];
}